

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_trie.cpp
# Opt level: O1

RK_S32 mpp_trie_walk(MppTrieNode *node,RK_U64 *tag_val,RK_S32 *tag_len,RK_U32 key)

{
  short sVar1;
  uint uVar2;
  RK_U64 RVar3;
  RK_U64 RVar4;
  RK_S32 RVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar8 = (ulong)key;
  RVar3 = *tag_val;
  uVar2 = *tag_len;
  sVar1 = node->tag_len;
  uVar6 = (ulong)(uint)(int)sVar1;
  if ((int)uVar2 < (int)sVar1) {
    uVar7 = uVar8 | RVar3 << 4;
    *tag_val = uVar7;
    *tag_len = uVar2 + 1;
    if ((mpp_trie_debug & 0x10) != 0) {
      _mpp_log_l(4,"mpp_trie",
                 "node %d:%d tag len %d - %d val %016llx - %016llx -> key %x -> tag fill\n",
                 "mpp_trie_walk",(ulong)(uint)(int)node->idx,(ulong)(uint)node->id,uVar6,
                 (ulong)(uVar2 + 1),node->tag_val,uVar7,uVar8);
    }
    RVar5 = (RK_S32)node->idx;
  }
  else if (sVar1 == 0) {
    if ((mpp_trie_debug & 0x10) != 0) {
      _mpp_log_l(4,"mpp_trie","node %d:%d -> key %x -> next %d\n","mpp_trie_walk",
                 (ulong)(uint)(int)node->idx,(ulong)(uint)node->id,uVar8,
                 (ulong)(uint)(int)node->next[uVar8]);
    }
    RVar5 = (RK_S32)node->next[uVar8];
  }
  else {
    *tag_val = 0;
    *tag_len = 0;
    RVar4 = node->tag_val;
    if (RVar4 == RVar3) {
      if ((mpp_trie_debug & 0x10) != 0) {
        _mpp_log_l(4,"mpp_trie",
                   "node %d:%d tag len %d - %d val %016llx - %016llx -> tag match -> key %d next %d\n"
                   ,"mpp_trie_walk",(ulong)(uint)(int)node->idx,(ulong)(uint)node->id,uVar6,
                   (ulong)uVar2,RVar4,RVar3,uVar8,(ulong)(uint)(int)node->next[uVar8]);
      }
      RVar5 = (RK_S32)node->next[uVar8];
    }
    else {
      RVar5 = -1;
      if ((mpp_trie_debug & 0x10) != 0) {
        _mpp_log_l(4,"mpp_trie","node %d:%d tag len %d - %d val %016llx - %016llx -> tag mismatch\n"
                   ,"mpp_trie_walk",(ulong)(uint)(int)node->idx,(ulong)(uint)node->id,uVar6,
                   (ulong)uVar2,RVar4,RVar3);
      }
    }
  }
  return RVar5;
}

Assistant:

static RK_S32 mpp_trie_walk(MppTrieNode *node, RK_U64 *tag_val, RK_S32 *tag_len, RK_U32 key)
{
    RK_U64 val = *tag_val;
    RK_S32 len = *tag_len;

    if (node->tag_len > len) {
        *tag_val = (val << 4) | key;
        *tag_len = len + 1;

        trie_dbg_walk("node %d:%d tag len %d - %d val %016llx - %016llx -> key %x -> tag fill\n",
                      node->idx, node->id, node->tag_len, *tag_len, node->tag_val, *tag_val, key);

        return node->idx;
    }

    /* normal next switch node */
    if (!node->tag_len) {
        trie_dbg_walk("node %d:%d -> key %x -> next %d\n",
                      node->idx, node->id, key, node->next[key]);

        return node->next[key];
    }

    *tag_val = 0;
    *tag_len = 0;

    if (node->tag_val != val) {
        trie_dbg_walk("node %d:%d tag len %d - %d val %016llx - %016llx -> tag mismatch\n",
                      node->idx, node->id, node->tag_len, len, node->tag_val, val);
        return INVALID_NODE_ID;
    }

    trie_dbg_walk("node %d:%d tag len %d - %d val %016llx - %016llx -> tag match -> key %d next %d\n",
                  node->idx, node->id, node->tag_len, len, node->tag_val, val, key, node->next[key]);

    return node->next[key];
}